

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3d6ae::TestTestRunnerFixtureReporterNotifiedOfFailures::
~TestTestRunnerFixtureReporterNotifiedOfFailures
          (TestTestRunnerFixtureReporterNotifiedOfFailures *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfFailures)
{
    MockTest test1("test", false, false, 2);
    MockTest test2("test", true, false);
    MockTest test3("test", false, false, 3);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
	CHECK_EQUAL(5, reporter.summaryFailureCount);
}